

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

void __thiscall
Database::collect_garbage
          (Database *this,
          set<DatabaseSnapshot_*,_std::less<DatabaseSnapshot_*>,_std::allocator<DatabaseSnapshot_*>_>
          *working_snapshots)

{
  bool bVar1;
  reference ppOVar2;
  reference ppDVar3;
  reference ppOVar4;
  pointer pOVar5;
  iterator this_00;
  reference dsname;
  Database *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ds_2;
  iterator __end1_3;
  iterator __begin1_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_3;
  unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_> *set;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
  *__range1_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  drop_list;
  OnDiskDataset *ds_1;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *__range2;
  DatabaseSnapshot *snap;
  iterator __end1_1;
  iterator __begin1_1;
  set<DatabaseSnapshot_*,_std::less<DatabaseSnapshot_*>,_std::allocator<DatabaseSnapshot_*>_>
  *__range1_1;
  OnDiskDataset *ds;
  const_iterator __end1;
  const_iterator __begin1;
  vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_> *__range1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  required_datasets;
  set<DatabaseSnapshot_*,_std::less<DatabaseSnapshot_*>,_std::allocator<DatabaseSnapshot_*>_>
  *in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffe70;
  key_type *in_stack_fffffffffffffe78;
  string *in_stack_fffffffffffffe80;
  value_type *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_118;
  undefined1 *local_110;
  reference local_108;
  unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_> *local_100;
  __normal_iterator<const_std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_*,_std::vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>_>
  local_f8;
  vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
  *local_f0;
  undefined1 local_e8 [24];
  _Base_ptr local_d0;
  undefined1 local_c8;
  OnDiskDataset *local_c0;
  OnDiskDataset **local_b8;
  __normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
  local_b0;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *local_a8;
  DatabaseSnapshot *local_a0;
  _Self local_98;
  _Self local_90 [2];
  _Base_ptr local_80;
  undefined1 local_78;
  OnDiskDataset *local_70;
  OnDiskDataset **local_68;
  __normal_iterator<OnDiskDataset_*const_*,_std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>_>
  local_60 [3];
  vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_> *local_48;
  Database *in_stack_ffffffffffffffc0;
  
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x154691);
  local_48 = working_sets(in_RDI);
  local_60[0]._M_current =
       (OnDiskDataset **)
       std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>::begin
                 ((vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_> *)
                  in_stack_fffffffffffffe68);
  local_68 = (OnDiskDataset **)
             std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>::end
                       ((vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_> *)
                        in_stack_fffffffffffffe68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<OnDiskDataset_*const_*,_std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>_>
                        *)in_stack_fffffffffffffe70,
                       (__normal_iterator<OnDiskDataset_*const_*,_std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>_>
                        *)in_stack_fffffffffffffe68);
    if (!bVar1) break;
    ppOVar2 = __gnu_cxx::
              __normal_iterator<OnDiskDataset_*const_*,_std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>_>
              ::operator*(local_60);
    local_70 = *ppOVar2;
    OnDiskDataset::get_name_abi_cxx11_(local_70);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                     in_stack_fffffffffffffe88);
    local_80 = (_Base_ptr)pVar6.first._M_node;
    local_78 = pVar6.second;
    __gnu_cxx::
    __normal_iterator<OnDiskDataset_*const_*,_std::vector<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>_>
    ::operator++(local_60);
  }
  local_90[0]._M_node =
       (_Base_ptr)
       std::
       set<DatabaseSnapshot_*,_std::less<DatabaseSnapshot_*>,_std::allocator<DatabaseSnapshot_*>_>::
       begin(in_stack_fffffffffffffe68);
  local_98._M_node =
       (_Base_ptr)
       std::
       set<DatabaseSnapshot_*,_std::less<DatabaseSnapshot_*>,_std::allocator<DatabaseSnapshot_*>_>::
       end(in_stack_fffffffffffffe68);
  while( true ) {
    bVar1 = std::operator!=(local_90,&local_98);
    if (!bVar1) break;
    ppDVar3 = std::_Rb_tree_const_iterator<DatabaseSnapshot_*>::operator*
                        ((_Rb_tree_const_iterator<DatabaseSnapshot_*> *)in_stack_fffffffffffffe70);
    local_a0 = *ppDVar3;
    local_a8 = DatabaseSnapshot::get_datasets(local_a0);
    local_b0._M_current =
         (OnDiskDataset **)
         std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::begin
                   ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                    in_stack_fffffffffffffe68);
    local_b8 = (OnDiskDataset **)
               std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::end
                         ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                          in_stack_fffffffffffffe68);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                          *)in_stack_fffffffffffffe70,
                         (__normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                          *)in_stack_fffffffffffffe68);
      if (!bVar1) break;
      ppOVar4 = __gnu_cxx::
                __normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                ::operator*(&local_b0);
      local_c0 = *ppOVar4;
      OnDiskDataset::get_name_abi_cxx11_(local_c0);
      pVar6 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                       in_stack_fffffffffffffe88);
      local_d0 = (_Base_ptr)pVar6.first._M_node;
      in_stack_fffffffffffffe97 = pVar6.second;
      local_c8 = in_stack_fffffffffffffe97;
      __gnu_cxx::
      __normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
      ::operator++(&local_b0);
    }
    std::_Rb_tree_const_iterator<DatabaseSnapshot_*>::operator++
              ((_Rb_tree_const_iterator<DatabaseSnapshot_*> *)in_stack_fffffffffffffe70);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1548ed);
  local_f0 = loaded_sets(in_RDI);
  local_f8._M_current =
       (unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_> *)
       std::
       vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
       ::begin((vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
                *)in_stack_fffffffffffffe68);
  local_100 = (unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_> *)
              std::
              vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
              ::end((vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
                     *)in_stack_fffffffffffffe68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_*,_std::vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>_>
                        *)in_stack_fffffffffffffe70,
                       (__normal_iterator<const_std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_*,_std::vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>_>
                        *)in_stack_fffffffffffffe68);
    if (!bVar1) break;
    local_108 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_*,_std::vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>_>
                ::operator*(&local_f8);
    pOVar5 = std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>::operator->
                       ((unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_> *)0x154975);
    in_stack_fffffffffffffe80 = OnDiskDataset::get_name_abi_cxx11_(pOVar5);
    in_stack_fffffffffffffe78 =
         (key_type *)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    if (in_stack_fffffffffffffe78 == (key_type *)0x0) {
      pOVar5 = std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>::operator->
                         ((unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_> *)0x1549b5
                         );
      in_stack_fffffffffffffe70 = OnDiskDataset::get_name_abi_cxx11_(pOVar5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_*,_std::vector<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>_>
    ::operator++(&local_f8);
  }
  local_110 = local_e8;
  local_118._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffe68);
  this_00 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffe68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffe70,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffe68);
    if (!bVar1) break;
    dsname = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_118);
    destroy_dataset((Database *)this_00._M_current,dsname);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_118);
  }
  collect_stale_iterators(in_stack_ffffffffffffffc0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffe80);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x154abd);
  return;
}

Assistant:

void Database::collect_garbage(
    std::set<DatabaseSnapshot *> &working_snapshots) {
    std::set<std::string> required_datasets;

    for (const auto *ds : working_sets()) {
        required_datasets.insert(ds->get_name());
    }

    for (const auto *snap : working_snapshots) {
        for (const auto *ds : snap->get_datasets()) {
            required_datasets.insert(ds->get_name());
        }
    }

    std::vector<std::string> drop_list;
    for (const auto &set : loaded_sets()) {
        if (required_datasets.count(set->get_name()) == 0) {
            // set is loaded but not required
            drop_list.push_back(set->get_name());
        }
    }

    for (const auto &ds : drop_list) {
        destroy_dataset(ds);
    }

    collect_stale_iterators();
}